

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PoslistNearMerge(char **pp,char *aTmp,int nRight,int nLeft,char **pp1,char **pp2)

{
  bool bVar1;
  uint local_5c;
  char *pcStack_58;
  int res;
  char *aTmp2;
  char *pTmp2;
  char *pTmp1;
  char *p2;
  char *p1;
  char **pp2_local;
  char **pp1_local;
  int nLeft_local;
  int nRight_local;
  char *aTmp_local;
  char **pp_local;
  
  p2 = *pp1;
  pTmp1 = *pp2;
  local_5c = 1;
  pTmp2 = aTmp;
  p1 = (char *)pp2;
  pp2_local = pp1;
  pp1_local._0_4_ = nLeft;
  pp1_local._4_4_ = nRight;
  _nLeft_local = aTmp;
  aTmp_local = (char *)pp;
  fts3PoslistPhraseMerge(&pTmp2,nRight,0,0,pp1,pp2);
  aTmp2 = pTmp2;
  pcStack_58 = pTmp2;
  *pp2_local = p2;
  *(char **)p1 = pTmp1;
  fts3PoslistPhraseMerge(&aTmp2,(int)pp1_local,1,0,(char **)p1,pp2_local);
  if ((pTmp2 == _nLeft_local) || (aTmp2 == pcStack_58)) {
    if (pTmp2 == _nLeft_local) {
      bVar1 = aTmp2 != pcStack_58;
      if (bVar1) {
        fts3PoslistCopy((char **)aTmp_local,&stack0xffffffffffffffa8);
      }
      local_5c = (uint)bVar1;
    }
    else {
      fts3PoslistCopy((char **)aTmp_local,(char **)&nLeft_local);
    }
  }
  else {
    fts3PoslistMerge((char **)aTmp_local,(char **)&nLeft_local,&stack0xffffffffffffffa8);
  }
  return local_5c;
}

Assistant:

static int fts3PoslistNearMerge(
  char **pp,                      /* Output buffer */
  char *aTmp,                     /* Temporary buffer space */
  int nRight,                     /* Maximum difference in token positions */
  int nLeft,                      /* Maximum difference in token positions */
  char **pp1,                     /* IN/OUT: Left input list */
  char **pp2                      /* IN/OUT: Right input list */
){
  char *p1 = *pp1;
  char *p2 = *pp2;

  char *pTmp1 = aTmp;
  char *pTmp2;
  char *aTmp2;
  int res = 1;

  fts3PoslistPhraseMerge(&pTmp1, nRight, 0, 0, pp1, pp2);
  aTmp2 = pTmp2 = pTmp1;
  *pp1 = p1;
  *pp2 = p2;
  fts3PoslistPhraseMerge(&pTmp2, nLeft, 1, 0, pp2, pp1);
  if( pTmp1!=aTmp && pTmp2!=aTmp2 ){
    fts3PoslistMerge(pp, &aTmp, &aTmp2);
  }else if( pTmp1!=aTmp ){
    fts3PoslistCopy(pp, &aTmp);
  }else if( pTmp2!=aTmp2 ){
    fts3PoslistCopy(pp, &aTmp2);
  }else{
    res = 0;
  }

  return res;
}